

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

VariableNT __thiscall
adios2::IO::DefineVariable
          (IO *this,DataType type,string *name,Dims *shape,Dims *start,Dims *count,bool constantDims
          )

{
  IO *pointer;
  __type _Var1;
  Variable *variable;
  VariableNT local_b0;
  Dims *local_a8;
  vector *local_a0;
  vector *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pointer = this->m_IO;
  local_a0 = (vector *)shape;
  local_98 = (vector *)start;
  std::operator+(&local_90,"for variable name ",name);
  std::operator+(&local_50,&local_90,", in call to IO::DefineVariable");
  local_a8 = count;
  helper::CheckForNullptr<adios2::core::IO>(pointer,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  adios2::ToString_abi_cxx11_((DataType)&local_90);
  GetType<std::__cxx11::string>();
  _Var1 = std::operator==(&local_90,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if (_Var1) {
    variable = adios2::core::IO::DefineVariable<std::__cxx11::string>
                         ((string *)this->m_IO,(vector *)name,local_a0,local_98,SUB81(local_a8,0));
  }
  else {
    adios2::ToString_abi_cxx11_((DataType)&local_90);
    GetType<char>();
    _Var1 = std::operator==(&local_90,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    if (_Var1) {
      variable = adios2::core::IO::DefineVariable<char>
                           ((string *)this->m_IO,(vector *)name,local_a0,local_98,SUB81(local_a8,0))
      ;
    }
    else {
      adios2::ToString_abi_cxx11_((DataType)&local_90);
      GetType<signed_char>();
      _Var1 = std::operator==(&local_90,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      if (_Var1) {
        variable = adios2::core::IO::DefineVariable<signed_char>
                             ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                              SUB81(local_a8,0));
      }
      else {
        adios2::ToString_abi_cxx11_((DataType)&local_90);
        GetType<short>();
        _Var1 = std::operator==(&local_90,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        if (_Var1) {
          variable = adios2::core::IO::DefineVariable<short>
                               ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                SUB81(local_a8,0));
        }
        else {
          adios2::ToString_abi_cxx11_((DataType)&local_90);
          GetType<int>();
          _Var1 = std::operator==(&local_90,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          if (_Var1) {
            variable = adios2::core::IO::DefineVariable<int>
                                 ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                  SUB81(local_a8,0));
          }
          else {
            adios2::ToString_abi_cxx11_((DataType)&local_90);
            GetType<long>();
            _Var1 = std::operator==(&local_90,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_90);
            if (_Var1) {
              variable = adios2::core::IO::DefineVariable<long>
                                   ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                    SUB81(local_a8,0));
            }
            else {
              adios2::ToString_abi_cxx11_((DataType)&local_90);
              GetType<unsigned_char>();
              _Var1 = std::operator==(&local_90,&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_90);
              if (_Var1) {
                variable = adios2::core::IO::DefineVariable<unsigned_char>
                                     ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                      SUB81(local_a8,0));
              }
              else {
                adios2::ToString_abi_cxx11_((DataType)&local_90);
                GetType<unsigned_short>();
                _Var1 = std::operator==(&local_90,&local_70);
                std::__cxx11::string::~string((string *)&local_70);
                std::__cxx11::string::~string((string *)&local_90);
                if (_Var1) {
                  variable = adios2::core::IO::DefineVariable<unsigned_short>
                                       ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                        SUB81(local_a8,0));
                }
                else {
                  adios2::ToString_abi_cxx11_((DataType)&local_90);
                  GetType<unsigned_int>();
                  _Var1 = std::operator==(&local_90,&local_70);
                  std::__cxx11::string::~string((string *)&local_70);
                  std::__cxx11::string::~string((string *)&local_90);
                  if (_Var1) {
                    variable = adios2::core::IO::DefineVariable<unsigned_int>
                                         ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                          SUB81(local_a8,0));
                  }
                  else {
                    adios2::ToString_abi_cxx11_((DataType)&local_90);
                    GetType<unsigned_long>();
                    _Var1 = std::operator==(&local_90,&local_70);
                    std::__cxx11::string::~string((string *)&local_70);
                    std::__cxx11::string::~string((string *)&local_90);
                    if (_Var1) {
                      variable = adios2::core::IO::DefineVariable<unsigned_long>
                                           ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                            SUB81(local_a8,0));
                    }
                    else {
                      adios2::ToString_abi_cxx11_((DataType)&local_90);
                      GetType<float>();
                      _Var1 = std::operator==(&local_90,&local_70);
                      std::__cxx11::string::~string((string *)&local_70);
                      std::__cxx11::string::~string((string *)&local_90);
                      if (_Var1) {
                        variable = adios2::core::IO::DefineVariable<float>
                                             ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                              SUB81(local_a8,0));
                      }
                      else {
                        adios2::ToString_abi_cxx11_((DataType)&local_90);
                        GetType<double>();
                        _Var1 = std::operator==(&local_90,&local_70);
                        std::__cxx11::string::~string((string *)&local_70);
                        std::__cxx11::string::~string((string *)&local_90);
                        if (_Var1) {
                          variable = adios2::core::IO::DefineVariable<double>
                                               ((string *)this->m_IO,(vector *)name,local_a0,
                                                local_98,SUB81(local_a8,0));
                        }
                        else {
                          adios2::ToString_abi_cxx11_((DataType)&local_90);
                          GetType<long_double>();
                          _Var1 = std::operator==(&local_90,&local_70);
                          std::__cxx11::string::~string((string *)&local_70);
                          std::__cxx11::string::~string((string *)&local_90);
                          if (_Var1) {
                            variable = adios2::core::IO::DefineVariable<long_double>
                                                 ((string *)this->m_IO,(vector *)name,local_a0,
                                                  local_98,SUB81(local_a8,0));
                          }
                          else {
                            adios2::ToString_abi_cxx11_((DataType)&local_90);
                            GetType<std::complex<float>>();
                            _Var1 = std::operator==(&local_90,&local_70);
                            std::__cxx11::string::~string((string *)&local_70);
                            std::__cxx11::string::~string((string *)&local_90);
                            if (_Var1) {
                              variable = adios2::core::IO::DefineVariable<std::complex<float>>
                                                   ((string *)this->m_IO,(vector *)name,local_a0,
                                                    local_98,SUB81(local_a8,0));
                            }
                            else {
                              adios2::ToString_abi_cxx11_((DataType)&local_90);
                              GetType<std::complex<double>>();
                              _Var1 = std::operator==(&local_90,&local_70);
                              std::__cxx11::string::~string((string *)&local_70);
                              std::__cxx11::string::~string((string *)&local_90);
                              if (_Var1) {
                                variable = adios2::core::IO::DefineVariable<std::complex<double>>
                                                     ((string *)this->m_IO,(vector *)name,local_a0,
                                                      local_98,SUB81(local_a8,0));
                              }
                              else {
                                variable = (Variable *)0x0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  VariableNT::VariableNT(&local_b0,(VariableBase *)variable);
  return (VariableNT)local_b0.m_Variable;
}

Assistant:

VariableNT IO::DefineVariable(const DataType type, const std::string &name, const Dims &shape,
                              const Dims &start, const Dims &count, const bool constantDims)
{
    helper::CheckForNullptr(m_IO, "for variable name " + name + ", in call to IO::DefineVariable");
#define declare_type(T)                                                                            \
    if (ToString(type) == GetType<T>())                                                            \
    {                                                                                              \
        return VariableNT(&m_IO->DefineVariable<typename TypeInfo<T>::IOType>(                     \
            name, shape, start, count, constantDims));                                             \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else
    {
        return nullptr;
    }
}